

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qcompleter_p.cpp
# Opt level: O3

void QCompletionModel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == rowsAdded) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      return;
    case 1:
      QMap<QModelIndex,_QMap<QString,_QMatchData>_>::clear
                ((QMap<QModelIndex,_QMap<QString,_QMatchData>_> *)(*(long *)(_o + 0x18) + 0xa8));
      filter((QCompletionModel *)_o,(QStringList *)(*(long *)(_o + 0x18) + 0x70));
      return;
    case 2:
      rowsInserted((QCompletionModel *)_o);
      return;
    case 3:
      modelDestroyed((QCompletionModel *)_o);
      return;
    }
  }
  return;
}

Assistant:

void QCompletionModel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QCompletionModel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rowsAdded(); break;
        case 1: _t->invalidate(); break;
        case 2: _t->rowsInserted(); break;
        case 3: _t->modelDestroyed(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QCompletionModel::*)()>(_a, &QCompletionModel::rowsAdded, 0))
            return;
    }
}